

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O2

bool glcts::PipelineStatisticsQueryUtilities::executeQuery
               (GLenum query_type,GLuint qo_id,GLuint qo_bo_id,PFNQUERYDRAWHANDLERPROC pfn_draw,
               void *draw_user_arg,RenderContext *render_context,TestContext *test_context,
               ContextInfo *context_info,_test_execution_result *out_result)

{
  ostringstream *poVar1;
  GLuint *pGVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ContextType CVar6;
  undefined4 extraout_var;
  GLint *pGVar8;
  GLuint GVar9;
  GLenum value;
  GLenum value_00;
  GLint64 *pGVar10;
  GLuint GVar11;
  RenderContext *pRVar12;
  GLuint64 *pGVar13;
  GLuint result_uint;
  GLint result_int;
  GLuint *local_200;
  GLuint local_1f4;
  GLuint64 result_uint64;
  RenderContext *local_1e8;
  void *local_1e0;
  int local_1d8;
  GLint n_query_bits;
  GLint64 result_int64;
  undefined1 local_1b0 [384];
  long lVar7;
  
  local_1e0 = draw_user_arg;
  iVar5 = (*render_context->_vptr_RenderContext[3])(render_context);
  lVar7 = CONCAT44(extraout_var,iVar5);
  n_query_bits = 0;
  local_200 = (GLuint *)CONCAT44(local_200._4_4_,query_type);
  (**(code **)(lVar7 + 0xa28))(query_type,0x8864);
  iVar5 = (**(code **)(lVar7 + 0x800))();
  pGVar2 = local_200;
  if (iVar5 == 0) {
    local_1e8 = render_context;
    if (n_query_bits == 0) {
      local_1b0._0_8_ = test_context->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Skipping [");
      getStringForEnum_abi_cxx11_
                ((string *)&result_int64,
                 (PipelineStatisticsQueryUtilities *)((ulong)local_200 & 0xffffffff),value_00);
      std::operator<<((ostream *)poVar1,(string *)&result_int64);
      std::operator<<((ostream *)poVar1,"]: zero bits available for counter storage");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&result_int64);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    else {
      (**(code **)(lVar7 + 0x20))((ulong)local_200 & 0xffffffff,qo_id);
      iVar5 = (**(code **)(lVar7 + 0x800))();
      if (iVar5 != 0) {
        local_1b0._0_8_ = test_context->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "A valid glBeginQuery() call generated the following error code:[");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,"]");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00ab9d41;
      }
      bVar3 = glu::ContextInfo::isExtensionSupported(context_info,"GL_ARB_query_buffer_object");
      pRVar12 = local_1e8;
      local_1f4 = 0;
      if ((qo_bo_id != 0) && (bVar3)) {
        (**(code **)(lVar7 + 0x40))(0x9192);
        iVar5 = (**(code **)(lVar7 + 0x800))();
        local_1f4 = qo_bo_id;
        if (iVar5 == 0) goto LAB_00ab9f36;
        local_1b0._0_8_ = test_context->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,
                        "Could not bind a buffer object to GL_QUERY_BUFFER buffer object binding point. Error reported:["
                       );
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,"]");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        (**(code **)(lVar7 + 0x628))((ulong)pGVar2 & 0xffffffff);
        goto LAB_00ab9d49;
      }
LAB_00ab9f36:
      if (pfn_draw != (PFNQUERYDRAWHANDLERPROC)0x0) {
        (*pfn_draw)(local_1e0);
      }
      (**(code **)(lVar7 + 0x628))((ulong)pGVar2 & 0xffffffff);
      iVar5 = (**(code **)(lVar7 + 0x800))();
      if (iVar5 != 0) {
        local_1b0._0_8_ = test_context->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"glEndQuery() call failed with error code[");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,"]");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00ab9d41;
      }
      GVar9 = local_1f4;
      local_1d8 = 2;
      while (iVar5 = local_1d8, local_1d8 = iVar5 + -1, iVar5 != 0) {
        result_uint = 0xffffffff;
        result_int = 0x7fffffff;
        result_uint64 = 0xffffffffffffffff;
        result_int64 = 0x7fffffffffffffff;
        if (iVar5 != 1 || GVar9 != 0) {
          bVar3 = iVar5 == 2;
          pGVar8 = (GLint *)0x0;
          if (bVar3) {
            pGVar8 = &result_int;
          }
          pGVar10 = (GLint64 *)0x8;
          if (bVar3) {
            pGVar10 = &result_int64;
          }
          local_200 = (GLuint *)0x10;
          if (bVar3) {
            local_200 = &result_uint;
          }
          pGVar13 = (GLuint64 *)0x18;
          if (bVar3) {
            pGVar13 = &result_uint64;
          }
          local_1e0 = (void *)CONCAT44(local_1e0._4_4_,iVar5);
          GVar11 = 0;
          if (iVar5 == 1) {
            GVar11 = GVar9;
          }
          (**(code **)(lVar7 + 0x40))(0x9192,GVar11);
          iVar5 = (**(code **)(lVar7 + 0x800))();
          if (iVar5 != 0) {
            local_1b0._0_8_ = test_context->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,
                            "glBindBuffer() call failed for GL_QUERY_BUFFER target with error [");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<((ostream *)poVar1,"]");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00ab9d41;
          }
          CVar6.super_ApiType.m_bits = (ApiType)(*pRVar12->_vptr_RenderContext[2])(pRVar12);
          bVar3 = glu::contextSupports(CVar6,(ApiType)0x133);
          if (bVar3) {
            (**(code **)(lVar7 + 0xa08))(qo_id,0x8866,pGVar10);
            iVar5 = (**(code **)(lVar7 + 0x800))();
            if (iVar5 != 0) {
              local_1b0._0_8_ = test_context->m_log;
              poVar1 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::operator<<((ostream *)poVar1,"glGetQueryObjecti64v() call failed with error [");
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::operator<<((ostream *)poVar1,"]");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_00ab9d41;
            }
          }
          (**(code **)(lVar7 + 0xa10))(qo_id,0x8866,pGVar8);
          iVar5 = (**(code **)(lVar7 + 0x800))();
          pRVar12 = local_1e8;
          if (iVar5 != 0) {
            local_1b0._0_8_ = test_context->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,"glGetQueryObjectiv() call failed with error [");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<((ostream *)poVar1,"]");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00ab9d41;
          }
          CVar6.super_ApiType.m_bits = (ApiType)(*local_1e8->_vptr_RenderContext[2])(local_1e8);
          bVar4 = glu::contextSupports(CVar6,(ApiType)0x133);
          if (bVar4) {
            (**(code **)(lVar7 + 0xa18))(qo_id,0x8866,pGVar13);
            iVar5 = (**(code **)(lVar7 + 0x800))();
            if (iVar5 != 0) {
              local_1b0._0_8_ = test_context->m_log;
              poVar1 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::operator<<((ostream *)poVar1,"glGetQueryObjectui64v() call failed with error [");
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::operator<<((ostream *)poVar1,"]");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_00ab9d41;
            }
          }
          (**(code **)(lVar7 + 0xa20))(qo_id,0x8866,local_200);
          iVar5 = (**(code **)(lVar7 + 0x800))();
          if (iVar5 != 0) {
            local_1b0._0_8_ = test_context->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,"glGetQueryObjectuiv() call failed with error [");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<((ostream *)poVar1,"]");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00ab9d41;
          }
          if ((int)local_1e0 == 1) {
            pGVar8 = (GLint *)(**(code **)(lVar7 + 0xcf8))(0x9192,35000);
            iVar5 = (**(code **)(lVar7 + 0x800))();
            if ((pGVar8 == (GLint *)0x0) || (iVar5 != 0)) {
              local_1b0._0_8_ = test_context->m_log;
              poVar1 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::operator<<((ostream *)poVar1,"QO BO mapping failed with error [");
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::operator<<((ostream *)poVar1,"] and data ptr returned:[");
              std::operator<<((ostream *)poVar1,(char *)pGVar8);
              std::operator<<((ostream *)poVar1,"]");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_00ab9d41;
            }
            result_int = *pGVar8;
            result_int64 = *(GLint64 *)(pGVar8 + 2);
            result_uint = pGVar8[4];
            result_uint64 = *(GLuint64 *)(pGVar8 + 6);
            (**(code **)(lVar7 + 0x1670))(0x9192);
            iVar5 = (**(code **)(lVar7 + 0x800))();
            if (iVar5 != 0) {
              local_1b0._0_8_ = test_context->m_log;
              poVar1 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::operator<<((ostream *)poVar1,"QO BO unmapping failed with error [");
              std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              std::operator<<((ostream *)poVar1,"]");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              goto LAB_00ab9d41;
            }
            out_result->result_qo_int = result_int;
            out_result->result_qo_int64 = result_int64;
            out_result->result_qo_uint = result_uint;
            out_result->result_qo_uint64 = result_uint64;
          }
          else {
            out_result->result_int = result_int;
            out_result->result_int64 = result_int64;
            out_result->result_uint = result_uint;
            out_result->result_uint64 = result_uint64;
          }
          out_result->int64_written = bVar3;
          out_result->uint64_written = bVar4;
          GVar9 = local_1f4;
        }
      }
    }
    bVar3 = true;
  }
  else {
    local_1b0._0_8_ = test_context->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "glGetQueryiv() call failed for GL_QUERY_COUNTER_BITS pname and ");
    getStringForEnum_abi_cxx11_
              ((string *)&result_int64,
               (PipelineStatisticsQueryUtilities *)((ulong)local_200 & 0xffffffff),value);
    std::operator<<((ostream *)poVar1,(string *)&result_int64);
    std::operator<<((ostream *)poVar1,"query target.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&result_int64);
LAB_00ab9d41:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
LAB_00ab9d49:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool PipelineStatisticsQueryUtilities::executeQuery(glw::GLenum query_type, glw::GLuint qo_id, glw::GLuint qo_bo_id,
													PFNQUERYDRAWHANDLERPROC pfn_draw, void* draw_user_arg,
													const glu::RenderContext& render_context,
													tcu::TestContext&		  test_context,
													const glu::ContextInfo&   context_info,
													_test_execution_result*   out_result)
{
	glw::GLenum			  error_code = GL_NO_ERROR;
	const glw::Functions& gl		 = render_context.getFunctions();
	bool				  result	 = true;

	/* Check if the implementation provides non-zero number of bits for the query.
	 * Queries, for which GL implementations provide zero bits of space return
	 * indeterminate values, so we should skip them */
	glw::GLint n_query_bits = 0;

	gl.getQueryiv(query_type, GL_QUERY_COUNTER_BITS, &n_query_bits);

	error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		test_context.getLog() << tcu::TestLog::Message
							  << "glGetQueryiv() call failed for GL_QUERY_COUNTER_BITS pname and "
							  << PipelineStatisticsQueryUtilities::getStringForEnum(query_type) << "query target."
							  << tcu::TestLog::EndMessage;

		return false;
	}

	if (n_query_bits == 0)
	{
		test_context.getLog() << tcu::TestLog::Message << "Skipping "
														  "["
							  << PipelineStatisticsQueryUtilities::getStringForEnum(query_type)
							  << "]"
								 ": zero bits available for counter storage"
							  << tcu::TestLog::EndMessage;

		return result;
	}

	/* Start the query */
	gl.beginQuery(query_type, qo_id);

	error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		test_context.getLog() << tcu::TestLog::Message
							  << "A valid glBeginQuery() call generated the following error code:"
								 "["
							  << error_code << "]" << tcu::TestLog::EndMessage;

		return false;
	}

	/* If GL_ARB_query_buffer_object is supported and the caller supplied a BO id, use
	 * it before we fire any draw calls */
	if (context_info.isExtensionSupported("GL_ARB_query_buffer_object") && qo_bo_id != 0)
	{
		gl.bindBuffer(GL_QUERY_BUFFER, qo_bo_id);

		error_code = gl.getError();
		if (error_code != GL_NO_ERROR)
		{
			test_context.getLog() << tcu::TestLog::Message
								  << "Could not bind a buffer object to GL_QUERY_BUFFER buffer object "
									 "binding point. Error reported:"
									 "["
								  << error_code << "]" << tcu::TestLog::EndMessage;

			/* Stop the query before we leave */
			gl.endQuery(query_type);

			return false;
		} /* if (buffer binding operation failed) */
	}	 /* if (GL_ARB_query_buffer_object extension is supported and the supplied QO BO id
	 *     is not 0) */
	else
	{
		/* Reset the QO BO id, so that we can skip the checks later */
		qo_bo_id = 0;
	}

	/* Perform the draw calls, if any supplied call-back function pointer was supplied
	 * by the caller. */
	if (pfn_draw != DE_NULL)
	{
		pfn_draw(draw_user_arg);
	}

	/* End the query */
	gl.endQuery(query_type);

	error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		test_context.getLog() << tcu::TestLog::Message << "glEndQuery() call failed with error code"
														  "["
							  << error_code << "]" << tcu::TestLog::EndMessage;

		return false;
	} /* if (glEndQuery() call failed) */

	/* We now need to retrieve the result data using all query getter functions
	 * GL has to offer. This will be handled in two iterations:
	 *
	 * 1. The data will be retrieved using the getters without a QO BO being bound.
	 * 2. If QO was provided, we will need to issue all getter calls executed against
	 *    the QO BO. We will then need to retrieve that data directly from the BO
	 *    storage.
	 */
	const unsigned int iteration_index_wo_qo_bo   = 0;
	const unsigned int iteration_index_with_qo_bo = 1;

	for (unsigned int n_iteration = 0; n_iteration < 2; /* as per description */
		 ++n_iteration)
	{
		glw::GLint*	offset_int			 = DE_NULL;
		glw::GLint64*  offset_int64			 = DE_NULL;
		glw::GLuint*   offset_uint			 = DE_NULL;
		glw::GLuint64* offset_uint64		 = DE_NULL;
		glw::GLint	 result_int			 = INT_MAX;
		glw::GLint64   result_int64			 = LLONG_MAX;
		bool		   result_int64_written  = false;
		glw::GLuint	result_uint			 = UINT_MAX;
		glw::GLuint64  result_uint64		 = ULLONG_MAX;
		bool		   result_uint64_written = false;

		/* Skip the QO BO iteration if QO BO id has not been provided */
		if (n_iteration == iteration_index_with_qo_bo && qo_bo_id == 0)
		{
			continue;
		}

		/* Determine the offsets we should use for the getter calls */
		if (n_iteration == iteration_index_wo_qo_bo)
		{
			offset_int	= &result_int;
			offset_int64  = &result_int64;
			offset_uint   = &result_uint;
			offset_uint64 = &result_uint64;
		}
		else
		{
			offset_int	= (glw::GLint*)(deUintptr)PipelineStatisticsQueryUtilities::qo_bo_int_offset;
			offset_int64  = (glw::GLint64*)(deUintptr)PipelineStatisticsQueryUtilities::qo_bo_int64_offset;
			offset_uint   = (glw::GLuint*)(deUintptr)PipelineStatisticsQueryUtilities::qo_bo_uint_offset;
			offset_uint64 = (glw::GLuint64*)(deUintptr)PipelineStatisticsQueryUtilities::qo_bo_uint64_offset;
		}

		/* Bind the QO BO if we need to use it for the getter calls */
		if (n_iteration == iteration_index_with_qo_bo)
		{
			gl.bindBuffer(GL_QUERY_BUFFER, qo_bo_id);
		}
		else
		{
			gl.bindBuffer(GL_QUERY_BUFFER, 0 /* buffer */);
		}

		error_code = gl.getError();
		if (error_code != GL_NO_ERROR)
		{
			test_context.getLog() << tcu::TestLog::Message
								  << "glBindBuffer() call failed for GL_QUERY_BUFFER target with error "
									 "["
								  << error_code << "]" << tcu::TestLog::EndMessage;

			return false;
		}

		/* Issue the getter calls.
		 *
		 * NOTE: 64-bit getter calls are supported only if >= GL 3.3*/
		if (glu::contextSupports(render_context.getType(), glu::ApiType::core(3, 3)))
		{
			gl.getQueryObjecti64v(qo_id, GL_QUERY_RESULT, offset_int64);

			error_code = gl.getError();
			if (error_code != GL_NO_ERROR)
			{
				test_context.getLog() << tcu::TestLog::Message << "glGetQueryObjecti64v() call failed with error "
																  "["
									  << error_code << "]" << tcu::TestLog::EndMessage;

				return false;
			}

			result_int64_written = true;
		}
		else
		{
			result_int64_written = false;
		}

		gl.getQueryObjectiv(qo_id, GL_QUERY_RESULT, offset_int);

		error_code = gl.getError();
		if (error_code != GL_NO_ERROR)
		{
			test_context.getLog() << tcu::TestLog::Message << "glGetQueryObjectiv() call failed with error "
															  "["
								  << error_code << "]" << tcu::TestLog::EndMessage;

			return false;
		}

		if (glu::contextSupports(render_context.getType(), glu::ApiType::core(3, 3)))
		{
			gl.getQueryObjectui64v(qo_id, GL_QUERY_RESULT, offset_uint64);

			error_code = gl.getError();
			if (error_code != GL_NO_ERROR)
			{
				test_context.getLog() << tcu::TestLog::Message << "glGetQueryObjectui64v() call failed with error "
																  "["
									  << error_code << "]" << tcu::TestLog::EndMessage;

				return false;
			}

			result_uint64_written = true;
		}
		else
		{
			result_uint64_written = false;
		}

		gl.getQueryObjectuiv(qo_id, GL_QUERY_RESULT, offset_uint);

		error_code = gl.getError();
		if (error_code != GL_NO_ERROR)
		{
			test_context.getLog() << tcu::TestLog::Message << "glGetQueryObjectuiv() call failed with error "
															  "["
								  << error_code << "]" << tcu::TestLog::EndMessage;

			return false;
		}

		/* If the getters wrote the result values to the BO, we need to retrieve the data
		 * from the BO storage */
		if (n_iteration == iteration_index_with_qo_bo)
		{
			/* Map the BO to process space */
			const unsigned char* bo_data_ptr = (const unsigned char*)gl.mapBuffer(GL_QUERY_BUFFER, GL_READ_ONLY);

			error_code = gl.getError();

			if (error_code != GL_NO_ERROR || bo_data_ptr == NULL)
			{
				test_context.getLog() << tcu::TestLog::Message << "QO BO mapping failed with error "
																  "["
									  << error_code << "] and data ptr returned:"
													   "["
									  << bo_data_ptr << "]" << tcu::TestLog::EndMessage;

				return false;
			}

			/* Retrieve the query result data */
			result_int	= *(glw::GLint*)(bo_data_ptr + (int)(deIntptr)offset_int);
			result_int64  = *(glw::GLint64*)(bo_data_ptr + (int)(deIntptr)offset_int64);
			result_uint   = *(glw::GLuint*)(bo_data_ptr + (int)(deIntptr)offset_uint);
			result_uint64 = *(glw::GLuint64*)(bo_data_ptr + (int)(deIntptr)offset_uint64);

			/* Unmap the BO */
			gl.unmapBuffer(GL_QUERY_BUFFER);

			error_code = gl.getError();
			if (error_code != GL_NO_ERROR)
			{
				test_context.getLog() << tcu::TestLog::Message << "QO BO unmapping failed with error "
																  "["
									  << error_code << "]" << tcu::TestLog::EndMessage;

				return false;
			}
		} /* if (QO BO iteration) */

		/* Store the retrieved data in user-provided location */
		if (n_iteration == iteration_index_with_qo_bo)
		{
			out_result->result_qo_int	= result_int;
			out_result->result_qo_int64  = result_int64;
			out_result->result_qo_uint   = result_uint;
			out_result->result_qo_uint64 = result_uint64;
		}
		else
		{
			out_result->result_int	= result_int;
			out_result->result_int64  = result_int64;
			out_result->result_uint   = result_uint;
			out_result->result_uint64 = result_uint64;
		}

		out_result->int64_written  = result_int64_written;
		out_result->uint64_written = result_uint64_written;
	} /* for (both iterations) */
	return result;
}